

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_16777232,_true,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::TriangleMvMBIntersectorKPluecker<4,_4,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  float *pfVar11;
  float *pfVar12;
  float *pfVar13;
  float *pfVar14;
  float *pfVar15;
  float *pfVar16;
  float *pfVar17;
  float *pfVar18;
  undefined4 uVar19;
  int iVar20;
  undefined4 uVar21;
  size_t sVar22;
  undefined8 uVar23;
  Geometry *pGVar24;
  bool bVar25;
  bool bVar26;
  bool bVar27;
  bool bVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  StackItemT<embree::NodeRefPtr<4>_> *pSVar35;
  int iVar36;
  AABBNodeMB4D *node1;
  ulong uVar37;
  ulong uVar38;
  RTCRayN *pRVar39;
  undefined4 uVar40;
  size_t sVar41;
  ulong uVar42;
  ulong uVar43;
  ulong uVar44;
  ulong uVar45;
  long lVar46;
  ulong uVar47;
  long lVar48;
  long lVar49;
  float fVar50;
  float fVar71;
  float fVar72;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  float fVar73;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar68;
  undefined1 auVar69 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar70;
  float fVar74;
  float fVar81;
  float fVar82;
  float fVar83;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  StackItemT<embree::NodeRefPtr<4>_> SVar86;
  undefined1 auVar87 [16];
  float fVar89;
  undefined1 auVar88 [16];
  float fVar90;
  uint uVar91;
  float fVar96;
  float fVar98;
  undefined1 auVar92 [16];
  StackItemT<embree::NodeRefPtr<4>_> SVar93;
  uint uVar97;
  uint uVar99;
  float fVar100;
  uint uVar101;
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  float fVar102;
  float fVar107;
  float fVar108;
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  float fVar109;
  undefined1 auVar106 [16];
  float fVar110;
  float fVar117;
  float fVar118;
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  StackItemT<embree::NodeRefPtr<4>_> SVar115;
  float fVar119;
  undefined1 auVar116 [16];
  float fVar120;
  float fVar121;
  float fVar126;
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar127 [16];
  float fVar128;
  float fVar130;
  float fVar131;
  float fVar132;
  undefined1 auVar129 [16];
  undefined1 auVar133 [16];
  float fVar134;
  float fVar135;
  float fVar136;
  float fVar137;
  float fVar138;
  float fVar139;
  float fVar140;
  float fVar141;
  float fVar142;
  float fVar145;
  float fVar146;
  float fVar147;
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  float fVar148;
  float fVar150;
  float fVar151;
  float fVar152;
  undefined1 auVar149 [16];
  undefined1 local_1301;
  StackItemT<embree::NodeRefPtr<4>_> *local_1300;
  ulong local_12f8;
  ulong local_12f0;
  float local_12e8;
  float fStack_12e4;
  float fStack_12e0;
  float fStack_12dc;
  Scene *local_12d8;
  float fStack_12d0;
  float fStack_12cc;
  vbool<4> valid;
  undefined8 local_1288;
  undefined8 uStack_1280;
  undefined8 *local_1270;
  ulong local_1268;
  ulong local_1260;
  ulong local_1258;
  ulong local_1250;
  RTCFilterFunctionNArguments args;
  vfloat<4> tNear;
  undefined1 local_11a8 [16];
  undefined1 local_1198 [16];
  float local_1188 [4];
  undefined1 local_1178 [16];
  undefined1 local_1168 [16];
  undefined1 local_1158 [16];
  float local_1148;
  float fStack_1144;
  float fStack_1140;
  float fStack_113c;
  float local_1138;
  float fStack_1134;
  float fStack_1130;
  float fStack_112c;
  float local_1128;
  float fStack_1124;
  float fStack_1120;
  float fStack_111c;
  float local_1118;
  float fStack_1114;
  float fStack_1110;
  float fStack_110c;
  float local_1108;
  float fStack_1104;
  float fStack_1100;
  float fStack_10fc;
  float local_10f8;
  float fStack_10f4;
  float fStack_10f0;
  float fStack_10ec;
  float local_10e8;
  float fStack_10e4;
  float fStack_10e0;
  float fStack_10dc;
  float local_10d8;
  float fStack_10d4;
  float fStack_10d0;
  float fStack_10cc;
  float local_10c8;
  float fStack_10c4;
  float fStack_10c0;
  float fStack_10bc;
  undefined1 local_10b8 [16];
  undefined1 local_10a8 [16];
  float local_1098;
  float fStack_1094;
  float fStack_1090;
  float fStack_108c;
  undefined1 local_1088 [16];
  float local_1078;
  float fStack_1074;
  float fStack_1070;
  float fStack_106c;
  float local_1068;
  float fStack_1064;
  float fStack_1060;
  float fStack_105c;
  float local_1058;
  float fStack_1054;
  float fStack_1050;
  float fStack_104c;
  float local_1048;
  float fStack_1044;
  float fStack_1040;
  float fStack_103c;
  float local_1038;
  float fStack_1034;
  float fStack_1030;
  float fStack_102c;
  float local_1028;
  float fStack_1024;
  float fStack_1020;
  float fStack_101c;
  float local_1018;
  float fStack_1014;
  float fStack_1010;
  float fStack_100c;
  RTCHitN local_1008 [16];
  undefined1 local_ff8 [16];
  undefined1 local_fe8 [16];
  undefined4 local_fd8;
  undefined4 uStack_fd4;
  undefined4 uStack_fd0;
  undefined4 uStack_fcc;
  float local_fc8;
  float fStack_fc4;
  float fStack_fc0;
  float fStack_fbc;
  undefined1 local_fb8 [16];
  undefined1 local_fa8 [16];
  uint local_f98;
  uint uStack_f94;
  uint uStack_f90;
  uint uStack_f8c;
  uint local_f88;
  uint uStack_f84;
  uint uStack_f80;
  uint uStack_f7c;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  
  local_1300 = stack + 1;
  stack[0].ptr.ptr = root.ptr;
  stack[0].dist = 0;
  local_10d8 = *(float *)((long)&(tray->org).field_0 + k * 4);
  local_10e8 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  local_10f8 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_1108 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  local_1118 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  local_1128 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  local_1148 = local_1108 * 0.99999964;
  fVar120 = local_1118 * 0.99999964;
  local_1138 = local_1128 * 0.99999964;
  local_1108 = local_1108 * 1.0000004;
  local_1118 = local_1118 * 1.0000004;
  local_1128 = local_1128 * 1.0000004;
  local_1250 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar44 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar47 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  local_1258 = local_1250 ^ 0x10;
  local_1260 = uVar44 ^ 0x10;
  local_1268 = uVar47 ^ 0x10;
  iVar36 = (tray->tnear).field_0.i[k];
  auVar127._4_4_ = iVar36;
  auVar127._0_4_ = iVar36;
  auVar127._8_4_ = iVar36;
  auVar127._12_4_ = iVar36;
  iVar36 = (tray->tfar).field_0.i[k];
  auVar61._4_4_ = iVar36;
  auVar61._0_4_ = iVar36;
  auVar61._8_4_ = iVar36;
  auVar61._12_4_ = iVar36;
  local_1270 = (undefined8 *)(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  fStack_10d4 = local_10d8;
  fStack_10d0 = local_10d8;
  fStack_10cc = local_10d8;
  fStack_10e4 = local_10e8;
  fStack_10e0 = local_10e8;
  fStack_10dc = local_10e8;
  fStack_10f4 = local_10f8;
  fStack_10f0 = local_10f8;
  fStack_10ec = local_10f8;
  fStack_1104 = local_1108;
  fStack_1100 = local_1108;
  fStack_10fc = local_1108;
  fStack_1114 = local_1118;
  fStack_1110 = local_1118;
  fStack_110c = local_1118;
  fStack_1124 = local_1128;
  fStack_1120 = local_1128;
  fStack_111c = local_1128;
  fStack_1134 = local_1138;
  fStack_1130 = local_1138;
  fStack_112c = local_1138;
  fStack_1144 = local_1148;
  fStack_1140 = local_1148;
  fStack_113c = local_1148;
  uVar43 = local_1260;
  uVar42 = local_1268;
  uVar38 = local_1258;
  fVar89 = local_10f8;
  fVar100 = local_10f8;
  fVar147 = local_10f8;
  fVar83 = local_10f8;
  fVar50 = local_1108;
  fVar71 = local_1108;
  fVar72 = local_1108;
  fVar73 = local_1108;
  fVar74 = local_1118;
  fVar81 = local_1118;
  fVar82 = local_1118;
  fVar90 = local_1118;
  fVar96 = local_1148;
  fVar98 = local_1148;
  fVar102 = local_1148;
  fVar107 = local_1148;
  fVar108 = local_10d8;
  fVar109 = local_10d8;
  fVar110 = local_10d8;
  fVar117 = local_10d8;
  fVar118 = local_10e8;
  fVar119 = local_10e8;
  fVar121 = local_10e8;
  fVar126 = local_10e8;
  fVar128 = local_1128;
  fVar130 = local_1128;
  fVar131 = local_1128;
  fVar132 = local_1128;
  fVar134 = local_1138;
  fVar135 = local_1138;
  fVar136 = local_1138;
  fVar137 = local_1138;
  local_12f8 = uVar47;
  local_12f0 = uVar44;
  do {
    do {
      do {
        if (local_1300 == stack) {
          return;
        }
        pSVar35 = local_1300 + -1;
        local_1300 = local_1300 + -1;
      } while (*(float *)(ray + k * 4 + 0x80) <= (float)pSVar35->dist &&
               (float)pSVar35->dist != *(float *)(ray + k * 4 + 0x80));
      sVar41 = (local_1300->ptr).ptr;
      do {
        if ((sVar41 & 8) == 0) {
          uVar37 = sVar41 & 0xfffffffffffffff0;
          fVar138 = *(float *)(ray + k * 4 + 0x70);
          pfVar6 = (float *)(uVar37 + 0x80 + local_1250);
          pfVar1 = (float *)(uVar37 + 0x20 + local_1250);
          auVar84._0_4_ = ((*pfVar6 * fVar138 + *pfVar1) - fVar108) * fVar96;
          auVar84._4_4_ = ((pfVar6[1] * fVar138 + pfVar1[1]) - fVar109) * fVar98;
          auVar84._8_4_ = ((pfVar6[2] * fVar138 + pfVar1[2]) - fVar110) * fVar102;
          auVar84._12_4_ = ((pfVar6[3] * fVar138 + pfVar1[3]) - fVar117) * fVar107;
          pfVar6 = (float *)(uVar37 + 0x80 + uVar44);
          pfVar1 = (float *)(uVar37 + 0x20 + uVar44);
          auVar84 = maxps(auVar127,auVar84);
          auVar114._0_4_ = ((*pfVar6 * fVar138 + *pfVar1) - fVar118) * fVar120;
          auVar114._4_4_ = ((pfVar6[1] * fVar138 + pfVar1[1]) - fVar119) * fVar120;
          auVar114._8_4_ = ((pfVar6[2] * fVar138 + pfVar1[2]) - fVar121) * fVar120;
          auVar114._12_4_ = ((pfVar6[3] * fVar138 + pfVar1[3]) - fVar126) * fVar120;
          pfVar6 = (float *)(uVar37 + 0x80 + uVar47);
          pfVar1 = (float *)(uVar37 + 0x20 + uVar47);
          auVar103._0_4_ = ((*pfVar6 * fVar138 + *pfVar1) - fVar89) * fVar134;
          auVar103._4_4_ = ((pfVar6[1] * fVar138 + pfVar1[1]) - fVar100) * fVar135;
          auVar103._8_4_ = ((pfVar6[2] * fVar138 + pfVar1[2]) - fVar147) * fVar136;
          auVar103._12_4_ = ((pfVar6[3] * fVar138 + pfVar1[3]) - fVar83) * fVar137;
          auVar103 = maxps(auVar114,auVar103);
          tNear.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)maxps(auVar84,auVar103);
          pfVar7 = (float *)(uVar37 + 0x80 + uVar38);
          pfVar1 = (float *)(uVar37 + 0x20 + uVar38);
          pfVar8 = (float *)(uVar37 + 0x80 + uVar43);
          pfVar6 = (float *)(uVar37 + 0x20 + uVar43);
          auVar123._0_4_ = ((*pfVar7 * fVar138 + *pfVar1) - fVar108) * fVar50;
          auVar123._4_4_ = ((pfVar7[1] * fVar138 + pfVar1[1]) - fVar109) * fVar71;
          auVar123._8_4_ = ((pfVar7[2] * fVar138 + pfVar1[2]) - fVar110) * fVar72;
          auVar123._12_4_ = ((pfVar7[3] * fVar138 + pfVar1[3]) - fVar117) * fVar73;
          auVar111._0_4_ = ((*pfVar8 * fVar138 + *pfVar6) - fVar118) * fVar74;
          auVar111._4_4_ = ((pfVar8[1] * fVar138 + pfVar6[1]) - fVar119) * fVar81;
          auVar111._8_4_ = ((pfVar8[2] * fVar138 + pfVar6[2]) - fVar121) * fVar82;
          auVar111._12_4_ = ((pfVar8[3] * fVar138 + pfVar6[3]) - fVar126) * fVar90;
          pfVar6 = (float *)(uVar37 + 0x80 + uVar42);
          pfVar1 = (float *)(uVar37 + 0x20 + uVar42);
          auVar113._0_4_ = ((*pfVar6 * fVar138 + *pfVar1) - fVar89) * fVar128;
          auVar113._4_4_ = ((pfVar6[1] * fVar138 + pfVar1[1]) - fVar100) * fVar130;
          auVar113._8_4_ = ((pfVar6[2] * fVar138 + pfVar1[2]) - fVar147) * fVar131;
          auVar113._12_4_ = ((pfVar6[3] * fVar138 + pfVar1[3]) - fVar83) * fVar132;
          auVar103 = minps(auVar111,auVar113);
          auVar84 = minps(auVar61,auVar123);
          auVar84 = minps(auVar84,auVar103);
          if (((uint)sVar41 & 7) == 6) {
            bVar25 = (fVar138 < *(float *)(uVar37 + 0xf0) && *(float *)(uVar37 + 0xe0) <= fVar138)
                     && tNear.field_0._0_4_ <= auVar84._0_4_;
            bVar26 = (fVar138 < *(float *)(uVar37 + 0xf4) && *(float *)(uVar37 + 0xe4) <= fVar138)
                     && tNear.field_0._4_4_ <= auVar84._4_4_;
            bVar27 = (fVar138 < *(float *)(uVar37 + 0xf8) && *(float *)(uVar37 + 0xe8) <= fVar138)
                     && tNear.field_0._8_4_ <= auVar84._8_4_;
            bVar28 = (fVar138 < *(float *)(uVar37 + 0xfc) && *(float *)(uVar37 + 0xec) <= fVar138)
                     && tNear.field_0._12_4_ <= auVar84._12_4_;
          }
          else {
            bVar25 = tNear.field_0._0_4_ <= auVar84._0_4_;
            bVar26 = tNear.field_0._4_4_ <= auVar84._4_4_;
            bVar27 = tNear.field_0._8_4_ <= auVar84._8_4_;
            bVar28 = tNear.field_0._12_4_ <= auVar84._12_4_;
          }
          auVar51._0_4_ = (uint)bVar25 * -0x80000000;
          auVar51._4_4_ = (uint)bVar26 * -0x80000000;
          auVar51._8_4_ = (uint)bVar27 * -0x80000000;
          auVar51._12_4_ = (uint)bVar28 * -0x80000000;
          uVar40 = movmskps((int)root.ptr,auVar51);
          root.ptr = CONCAT44((int)(root.ptr >> 0x20),uVar40);
        }
        if ((sVar41 & 8) == 0) {
          if (root.ptr == 0) {
            iVar36 = 4;
          }
          else {
            uVar37 = sVar41 & 0xfffffffffffffff0;
            lVar46 = 0;
            if (root.ptr != 0) {
              for (; (root.ptr >> lVar46 & 1) == 0; lVar46 = lVar46 + 1) {
              }
            }
            iVar36 = 0;
            sVar41 = *(size_t *)(uVar37 + lVar46 * 8);
            uVar45 = root.ptr - 1 & root.ptr;
            if (uVar45 != 0) {
              uVar91 = tNear.field_0.i[lVar46];
              lVar46 = 0;
              if (uVar45 != 0) {
                for (; (uVar45 >> lVar46 & 1) == 0; lVar46 = lVar46 + 1) {
                }
              }
              sVar22 = *(size_t *)(uVar37 + lVar46 * 8);
              uVar97 = tNear.field_0.i[lVar46];
              uVar45 = uVar45 - 1 & uVar45;
              uVar44 = local_12f0;
              uVar47 = local_12f8;
              if (uVar45 == 0) {
                if (uVar91 < uVar97) {
                  (local_1300->ptr).ptr = sVar22;
                  local_1300->dist = uVar97;
                  local_1300 = local_1300 + 1;
                }
                else {
                  (local_1300->ptr).ptr = sVar41;
                  local_1300->dist = uVar91;
                  sVar41 = sVar22;
                  local_1300 = local_1300 + 1;
                }
              }
              else {
                auVar85._8_4_ = uVar91;
                auVar85._0_8_ = sVar41;
                auVar85._12_4_ = 0;
                auVar104._8_4_ = uVar97;
                auVar104._0_8_ = sVar22;
                auVar104._12_4_ = 0;
                lVar46 = 0;
                if (uVar45 != 0) {
                  for (; (uVar45 >> lVar46 & 1) == 0; lVar46 = lVar46 + 1) {
                  }
                }
                uVar23 = *(undefined8 *)(uVar37 + lVar46 * 8);
                iVar20 = tNear.field_0.i[lVar46];
                auVar92._8_4_ = iVar20;
                auVar92._0_8_ = uVar23;
                auVar92._12_4_ = 0;
                auVar52._8_4_ = -(uint)((int)uVar91 < (int)uVar97);
                uVar45 = uVar45 - 1 & uVar45;
                if (uVar45 == 0) {
                  auVar52._4_4_ = auVar52._8_4_;
                  auVar52._0_4_ = auVar52._8_4_;
                  auVar52._12_4_ = auVar52._8_4_;
                  auVar112._8_4_ = uVar97;
                  auVar112._0_8_ = sVar22;
                  auVar112._12_4_ = 0;
                  auVar113 = blendvps(auVar112,auVar85,auVar52);
                  auVar84 = blendvps(auVar85,auVar104,auVar52);
                  auVar53._8_4_ = -(uint)(auVar113._8_4_ < iVar20);
                  auVar53._4_4_ = auVar53._8_4_;
                  auVar53._0_4_ = auVar53._8_4_;
                  auVar53._12_4_ = auVar53._8_4_;
                  auVar105._8_4_ = iVar20;
                  auVar105._0_8_ = uVar23;
                  auVar105._12_4_ = 0;
                  auVar103 = blendvps(auVar105,auVar113,auVar53);
                  auVar113 = blendvps(auVar113,auVar92,auVar53);
                  auVar54._8_4_ = -(uint)(auVar84._8_4_ < auVar113._8_4_);
                  auVar54._4_4_ = auVar54._8_4_;
                  auVar54._0_4_ = auVar54._8_4_;
                  auVar54._12_4_ = auVar54._8_4_;
                  SVar93 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar113,auVar84,auVar54);
                  SVar86 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar84,auVar113,auVar54);
                  *local_1300 = SVar86;
                  local_1300[1] = SVar93;
                  sVar41 = auVar103._0_8_;
                  local_1300 = local_1300 + 2;
                }
                else {
                  lVar46 = 0;
                  if (uVar45 != 0) {
                    for (; (uVar45 >> lVar46 & 1) == 0; lVar46 = lVar46 + 1) {
                    }
                  }
                  auVar55._4_4_ = auVar52._8_4_;
                  auVar55._0_4_ = auVar52._8_4_;
                  auVar55._8_4_ = auVar52._8_4_;
                  auVar55._12_4_ = auVar52._8_4_;
                  auVar114 = blendvps(auVar104,auVar85,auVar55);
                  auVar84 = blendvps(auVar85,auVar104,auVar55);
                  auVar122._8_4_ = tNear.field_0.i[lVar46];
                  auVar122._0_8_ = *(undefined8 *)(uVar37 + lVar46 * 8);
                  auVar122._12_4_ = 0;
                  auVar56._8_4_ = -(uint)(iVar20 < tNear.field_0.i[lVar46]);
                  auVar56._4_4_ = auVar56._8_4_;
                  auVar56._0_4_ = auVar56._8_4_;
                  auVar56._12_4_ = auVar56._8_4_;
                  auVar113 = blendvps(auVar122,auVar92,auVar56);
                  auVar103 = blendvps(auVar92,auVar122,auVar56);
                  auVar57._8_4_ = -(uint)(auVar84._8_4_ < auVar103._8_4_);
                  auVar57._4_4_ = auVar57._8_4_;
                  auVar57._0_4_ = auVar57._8_4_;
                  auVar57._12_4_ = auVar57._8_4_;
                  auVar123 = blendvps(auVar103,auVar84,auVar57);
                  SVar86 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar84,auVar103,auVar57);
                  auVar58._8_4_ = -(uint)(auVar114._8_4_ < auVar113._8_4_);
                  auVar58._4_4_ = auVar58._8_4_;
                  auVar58._0_4_ = auVar58._8_4_;
                  auVar58._12_4_ = auVar58._8_4_;
                  auVar84 = blendvps(auVar113,auVar114,auVar58);
                  auVar103 = blendvps(auVar114,auVar113,auVar58);
                  auVar59._8_4_ = -(uint)(auVar103._8_4_ < auVar123._8_4_);
                  auVar59._4_4_ = auVar59._8_4_;
                  auVar59._0_4_ = auVar59._8_4_;
                  auVar59._12_4_ = auVar59._8_4_;
                  SVar93 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar123,auVar103,auVar59);
                  SVar115 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar103,auVar123,auVar59);
                  *local_1300 = SVar86;
                  local_1300[1] = SVar115;
                  local_1300[2] = SVar93;
                  sVar41 = auVar84._0_8_;
                  local_1300 = local_1300 + 3;
                }
              }
            }
          }
        }
        else {
          iVar36 = 6;
        }
      } while (iVar36 == 0);
    } while (iVar36 != 6);
    uVar43 = (ulong)((uint)sVar41 & 0xf);
    if (uVar43 != 8) {
      uVar42 = sVar41 & 0xfffffffffffffff0;
      lVar46 = 0;
      do {
        lVar49 = lVar46 * 0x140;
        fVar89 = *(float *)(ray + k * 4 + 0x70);
        pfVar9 = (float *)(uVar42 + 0x90 + lVar49);
        pfVar5 = (float *)(uVar42 + lVar49);
        pfVar10 = (float *)(uVar42 + 0xa0 + lVar49);
        pfVar1 = (float *)(uVar42 + 0x10 + lVar49);
        pfVar11 = (float *)(uVar42 + 0xb0 + lVar49);
        pfVar6 = (float *)(uVar42 + 0x20 + lVar49);
        pfVar12 = (float *)(uVar42 + 0xc0 + lVar49);
        pfVar7 = (float *)(uVar42 + 0x30 + lVar49);
        pfVar13 = (float *)(uVar42 + 0xd0 + lVar49);
        pfVar8 = (float *)(uVar42 + 0x40 + lVar49);
        pfVar14 = (float *)(uVar42 + 0xe0 + lVar49);
        pfVar2 = (float *)(uVar42 + 0x50 + lVar49);
        pfVar15 = (float *)(uVar42 + 0xf0 + lVar49);
        pfVar3 = (float *)(uVar42 + 0x60 + lVar49);
        pfVar16 = (float *)(uVar42 + 0x100 + lVar49);
        pfVar4 = (float *)(uVar42 + 0x70 + lVar49);
        pfVar17 = (float *)(uVar42 + 0x110 + lVar49);
        pfVar18 = (float *)(uVar42 + 0x80 + lVar49);
        fVar100 = *(float *)(ray + k * 4);
        fVar147 = *(float *)(ray + k * 4 + 0x10);
        fVar83 = *(float *)(ray + k * 4 + 0x20);
        local_1058 = (*pfVar9 * fVar89 + *pfVar5) - fVar100;
        fStack_1054 = (pfVar9[1] * fVar89 + pfVar5[1]) - fVar100;
        fStack_1050 = (pfVar9[2] * fVar89 + pfVar5[2]) - fVar100;
        fStack_104c = (pfVar9[3] * fVar89 + pfVar5[3]) - fVar100;
        fVar138 = (*pfVar10 * fVar89 + *pfVar1) - fVar147;
        fVar139 = (pfVar10[1] * fVar89 + pfVar1[1]) - fVar147;
        fVar140 = (pfVar10[2] * fVar89 + pfVar1[2]) - fVar147;
        fVar141 = (pfVar10[3] * fVar89 + pfVar1[3]) - fVar147;
        local_1018 = (*pfVar11 * fVar89 + *pfVar6) - fVar83;
        fStack_1014 = (pfVar11[1] * fVar89 + pfVar6[1]) - fVar83;
        fStack_1010 = (pfVar11[2] * fVar89 + pfVar6[2]) - fVar83;
        fStack_100c = (pfVar11[3] * fVar89 + pfVar6[3]) - fVar83;
        fVar50 = (*pfVar12 * fVar89 + *pfVar7) - fVar100;
        fVar71 = (pfVar12[1] * fVar89 + pfVar7[1]) - fVar100;
        fVar72 = (pfVar12[2] * fVar89 + pfVar7[2]) - fVar100;
        fVar73 = (pfVar12[3] * fVar89 + pfVar7[3]) - fVar100;
        fVar110 = (*pfVar13 * fVar89 + *pfVar8) - fVar147;
        fVar117 = (pfVar13[1] * fVar89 + pfVar8[1]) - fVar147;
        fVar118 = (pfVar13[2] * fVar89 + pfVar8[2]) - fVar147;
        fVar119 = (pfVar13[3] * fVar89 + pfVar8[3]) - fVar147;
        fVar134 = (*pfVar14 * fVar89 + *pfVar2) - fVar83;
        fVar135 = (pfVar14[1] * fVar89 + pfVar2[1]) - fVar83;
        fVar136 = (pfVar14[2] * fVar89 + pfVar2[2]) - fVar83;
        fVar137 = (pfVar14[3] * fVar89 + pfVar2[3]) - fVar83;
        fVar90 = (*pfVar15 * fVar89 + *pfVar3) - fVar100;
        fVar96 = (pfVar15[1] * fVar89 + pfVar3[1]) - fVar100;
        fVar98 = (pfVar15[2] * fVar89 + pfVar3[2]) - fVar100;
        fVar100 = (pfVar15[3] * fVar89 + pfVar3[3]) - fVar100;
        fVar142 = (*pfVar16 * fVar89 + *pfVar4) - fVar147;
        fVar145 = (pfVar16[1] * fVar89 + pfVar4[1]) - fVar147;
        fVar146 = (pfVar16[2] * fVar89 + pfVar4[2]) - fVar147;
        fVar147 = (pfVar16[3] * fVar89 + pfVar4[3]) - fVar147;
        fVar74 = (fVar89 * *pfVar17 + *pfVar18) - fVar83;
        fVar81 = (fVar89 * pfVar17[1] + pfVar18[1]) - fVar83;
        fVar82 = (fVar89 * pfVar17[2] + pfVar18[2]) - fVar83;
        fVar83 = (fVar89 * pfVar17[3] + pfVar18[3]) - fVar83;
        local_1028 = fVar90 - local_1058;
        fStack_1024 = fVar96 - fStack_1054;
        fStack_1020 = fVar98 - fStack_1050;
        fStack_101c = fVar100 - fStack_104c;
        local_1048 = fVar142 - fVar138;
        fStack_1044 = fVar145 - fVar139;
        fStack_1040 = fVar146 - fVar140;
        fStack_103c = fVar147 - fVar141;
        local_1038 = fVar74 - local_1018;
        fStack_1034 = fVar81 - fStack_1014;
        fStack_1030 = fVar82 - fStack_1010;
        fStack_102c = fVar83 - fStack_100c;
        fVar89 = *(float *)(ray + k * 4 + 0x50);
        local_1068 = *(float *)(ray + k * 4 + 0x60);
        fStack_12d0 = *(float *)(ray + k * 4 + 0x40);
        fVar121 = (local_1048 * (fVar74 + local_1018) - (fVar142 + fVar138) * local_1038) *
                  fStack_12d0 +
                  ((fVar90 + local_1058) * local_1038 - (fVar74 + local_1018) * local_1028) * fVar89
                  + (local_1028 * (fVar142 + fVar138) - (fVar90 + local_1058) * local_1048) *
                    local_1068;
        fVar126 = (fStack_1044 * (fVar81 + fStack_1014) - (fVar145 + fVar139) * fStack_1034) *
                  fStack_12d0 +
                  ((fVar96 + fStack_1054) * fStack_1034 - (fVar81 + fStack_1014) * fStack_1024) *
                  fVar89 + (fStack_1024 * (fVar145 + fVar139) - (fVar96 + fStack_1054) * fStack_1044
                           ) * local_1068;
        local_10b8._0_8_ = CONCAT44(fVar126,fVar121);
        local_10b8._8_4_ =
             (fStack_1040 * (fVar82 + fStack_1010) - (fVar146 + fVar140) * fStack_1030) *
             fStack_12d0 +
             ((fVar98 + fStack_1050) * fStack_1030 - (fVar82 + fStack_1010) * fStack_1020) * fVar89
             + (fStack_1020 * (fVar146 + fVar140) - (fVar98 + fStack_1050) * fStack_1040) *
               local_1068;
        local_10b8._12_4_ =
             (fStack_103c * (fVar83 + fStack_100c) - (fVar147 + fVar141) * fStack_102c) *
             fStack_12d0 +
             ((fVar100 + fStack_104c) * fStack_102c - (fVar83 + fStack_100c) * fStack_101c) * fVar89
             + (fStack_101c * (fVar147 + fVar141) - (fVar100 + fStack_104c) * fStack_103c) *
               local_1068;
        fVar102 = local_1058 - fVar50;
        fVar107 = fStack_1054 - fVar71;
        fVar108 = fStack_1050 - fVar72;
        fVar109 = fStack_104c - fVar73;
        fVar128 = fVar138 - fVar110;
        fVar130 = fVar139 - fVar117;
        fVar131 = fVar140 - fVar118;
        fVar132 = fVar141 - fVar119;
        local_1078 = local_1018 - fVar134;
        fStack_1074 = fStack_1014 - fVar135;
        fStack_1070 = fStack_1010 - fVar136;
        fStack_106c = fStack_100c - fVar137;
        local_10a8._0_4_ =
             (fVar128 * (local_1018 + fVar134) - (fVar138 + fVar110) * local_1078) * fStack_12d0 +
             ((local_1058 + fVar50) * local_1078 - (local_1018 + fVar134) * fVar102) * fVar89 +
             (fVar102 * (fVar138 + fVar110) - (local_1058 + fVar50) * fVar128) * local_1068;
        local_10a8._4_4_ =
             (fVar130 * (fStack_1014 + fVar135) - (fVar139 + fVar117) * fStack_1074) * fStack_12d0 +
             ((fStack_1054 + fVar71) * fStack_1074 - (fStack_1014 + fVar135) * fVar107) * fVar89 +
             (fVar107 * (fVar139 + fVar117) - (fStack_1054 + fVar71) * fVar130) * local_1068;
        local_10a8._8_4_ =
             (fVar131 * (fStack_1010 + fVar136) - (fVar140 + fVar118) * fStack_1070) * fStack_12d0 +
             ((fStack_1050 + fVar72) * fStack_1070 - (fStack_1010 + fVar136) * fVar108) * fVar89 +
             (fVar108 * (fVar140 + fVar118) - (fStack_1050 + fVar72) * fVar131) * local_1068;
        local_10a8._12_4_ =
             (fVar132 * (fStack_100c + fVar137) - (fVar141 + fVar119) * fStack_106c) * fStack_12d0 +
             ((fStack_104c + fVar73) * fStack_106c - (fStack_100c + fVar137) * fVar109) * fVar89 +
             (fVar109 * (fVar141 + fVar119) - (fStack_104c + fVar73) * fVar132) * local_1068;
        fVar148 = fVar50 - fVar90;
        fVar150 = fVar71 - fVar96;
        fVar151 = fVar72 - fVar98;
        fVar152 = fVar73 - fVar100;
        local_1088._0_4_ = fVar110 - fVar142;
        local_1088._4_4_ = fVar117 - fVar145;
        local_1088._8_4_ = fVar118 - fVar146;
        local_1088._12_4_ = fVar119 - fVar147;
        local_1098 = fVar134 - fVar74;
        fStack_1094 = fVar135 - fVar81;
        fStack_1090 = fVar136 - fVar82;
        fStack_108c = fVar137 - fVar83;
        fStack_1064 = local_1068;
        fStack_1060 = local_1068;
        fStack_105c = local_1068;
        auVar87._0_4_ =
             (local_1088._0_4_ * (fVar74 + fVar134) - (fVar142 + fVar110) * local_1098) *
             fStack_12d0 +
             ((fVar90 + fVar50) * local_1098 - (fVar74 + fVar134) * fVar148) * fVar89 +
             (fVar148 * (fVar142 + fVar110) - (fVar90 + fVar50) * local_1088._0_4_) * local_1068;
        auVar87._4_4_ =
             (local_1088._4_4_ * (fVar81 + fVar135) - (fVar145 + fVar117) * fStack_1094) *
             fStack_12d0 +
             ((fVar96 + fVar71) * fStack_1094 - (fVar81 + fVar135) * fVar150) * fVar89 +
             (fVar150 * (fVar145 + fVar117) - (fVar96 + fVar71) * local_1088._4_4_) * local_1068;
        auVar87._8_4_ =
             (local_1088._8_4_ * (fVar82 + fVar136) - (fVar146 + fVar118) * fStack_1090) *
             fStack_12d0 +
             ((fVar98 + fVar72) * fStack_1090 - (fVar82 + fVar136) * fVar151) * fVar89 +
             (fVar151 * (fVar146 + fVar118) - (fVar98 + fVar72) * local_1088._8_4_) * local_1068;
        auVar87._12_4_ =
             (local_1088._12_4_ * (fVar83 + fVar137) - (fVar147 + fVar119) * fStack_108c) *
             fStack_12d0 +
             ((fVar100 + fVar73) * fStack_108c - (fVar83 + fVar137) * fVar152) * fVar89 +
             (fVar152 * (fVar147 + fVar119) - (fVar100 + fVar73) * local_1088._12_4_) * local_1068;
        local_10c8 = fVar121 + local_10a8._0_4_ + auVar87._0_4_;
        fStack_10c4 = fVar126 + local_10a8._4_4_ + auVar87._4_4_;
        fStack_10c0 = local_10b8._8_4_ + local_10a8._8_4_ + auVar87._8_4_;
        fStack_10bc = local_10b8._12_4_ + local_10a8._12_4_ + auVar87._12_4_;
        auVar60._8_4_ = local_10b8._8_4_;
        auVar60._0_8_ = local_10b8._0_8_;
        auVar60._12_4_ = local_10b8._12_4_;
        auVar61 = minps(auVar60,local_10a8);
        auVar61 = minps(auVar61,auVar87);
        auVar143._8_4_ = local_10b8._8_4_;
        auVar143._0_8_ = local_10b8._0_8_;
        auVar143._12_4_ = local_10b8._12_4_;
        auVar84 = maxps(auVar143,local_10a8);
        auVar84 = maxps(auVar84,auVar87);
        fVar100 = ABS(local_10c8) * 1.1920929e-07;
        fVar147 = ABS(fStack_10c4) * 1.1920929e-07;
        fVar83 = ABS(fStack_10c0) * 1.1920929e-07;
        fVar50 = ABS(fStack_10bc) * 1.1920929e-07;
        auVar144._4_4_ = -(uint)(auVar84._4_4_ <= fVar147);
        auVar144._0_4_ = -(uint)(auVar84._0_4_ <= fVar100);
        auVar144._8_4_ = -(uint)(auVar84._8_4_ <= fVar83);
        auVar144._12_4_ = -(uint)(auVar84._12_4_ <= fVar50);
        auVar62._4_4_ = -(uint)(-fVar147 <= auVar61._4_4_);
        auVar62._0_4_ = -(uint)(-fVar100 <= auVar61._0_4_);
        auVar62._8_4_ = -(uint)(-fVar83 <= auVar61._8_4_);
        auVar62._12_4_ = -(uint)(-fVar50 <= auVar61._12_4_);
        auVar144 = auVar144 | auVar62;
        iVar36 = movmskps((int)&local_1301,auVar144);
        if (iVar36 != 0) {
          auVar124._0_4_ = local_1048 * local_1078 - fVar128 * local_1038;
          auVar124._4_4_ = fStack_1044 * fStack_1074 - fVar130 * fStack_1034;
          auVar124._8_4_ = fStack_1040 * fStack_1070 - fVar131 * fStack_1030;
          auVar124._12_4_ = fStack_103c * fStack_106c - fVar132 * fStack_102c;
          auVar129._0_4_ = fVar128 * local_1098 - local_1088._0_4_ * local_1078;
          auVar129._4_4_ = fVar130 * fStack_1094 - local_1088._4_4_ * fStack_1074;
          auVar129._8_4_ = fVar131 * fStack_1090 - local_1088._8_4_ * fStack_1070;
          auVar129._12_4_ = fVar132 * fStack_108c - local_1088._12_4_ * fStack_106c;
          uVar91 = (uint)DAT_01fec6c0;
          uVar97 = DAT_01fec6c0._4_4_;
          uVar99 = DAT_01fec6c0._8_4_;
          uVar101 = DAT_01fec6c0._12_4_;
          auVar63._4_4_ =
               -(uint)((float)((uint)(fVar130 * fStack_1034) & uVar97) <
                      (float)((uint)(local_1088._4_4_ * fStack_1074) & uVar97));
          auVar63._0_4_ =
               -(uint)((float)((uint)(fVar128 * local_1038) & uVar91) <
                      (float)((uint)(local_1088._0_4_ * local_1078) & uVar91));
          auVar63._8_4_ =
               -(uint)((float)((uint)(fVar131 * fStack_1030) & uVar99) <
                      (float)((uint)(local_1088._8_4_ * fStack_1070) & uVar99));
          auVar63._12_4_ =
               -(uint)((float)((uint)(fVar132 * fStack_102c) & uVar101) <
                      (float)((uint)(local_1088._12_4_ * fStack_106c) & uVar101));
          local_1178 = blendvps(auVar129,auVar124,auVar63);
          auVar149._0_4_ = fVar148 * local_1078 - fVar102 * local_1098;
          auVar149._4_4_ = fVar150 * fStack_1074 - fVar107 * fStack_1094;
          auVar149._8_4_ = fVar151 * fStack_1070 - fVar108 * fStack_1090;
          auVar149._12_4_ = fVar152 * fStack_106c - fVar109 * fStack_108c;
          auVar64._4_4_ =
               -(uint)((float)((uint)(fStack_1024 * fStack_1074) & uVar97) <
                      (float)((uint)(fVar107 * fStack_1094) & uVar97));
          auVar64._0_4_ =
               -(uint)((float)((uint)(local_1028 * local_1078) & uVar91) <
                      (float)((uint)(fVar102 * local_1098) & uVar91));
          auVar64._8_4_ =
               -(uint)((float)((uint)(fStack_1020 * fStack_1070) & uVar99) <
                      (float)((uint)(fVar108 * fStack_1090) & uVar99));
          auVar64._12_4_ =
               -(uint)((float)((uint)(fStack_101c * fStack_106c) & uVar101) <
                      (float)((uint)(fVar109 * fStack_108c) & uVar101));
          auVar29._4_4_ = fStack_1034 * fVar107 - fStack_1024 * fStack_1074;
          auVar29._0_4_ = local_1038 * fVar102 - local_1028 * local_1078;
          auVar29._8_4_ = fStack_1030 * fVar108 - fStack_1020 * fStack_1070;
          auVar29._12_4_ = fStack_102c * fVar109 - fStack_101c * fStack_106c;
          local_1168 = blendvps(auVar149,auVar29,auVar64);
          auVar106._0_4_ = local_1028 * fVar128 - fVar102 * local_1048;
          auVar106._4_4_ = fStack_1024 * fVar130 - fVar107 * fStack_1044;
          auVar106._8_4_ = fStack_1020 * fVar131 - fVar108 * fStack_1040;
          auVar106._12_4_ = fStack_101c * fVar132 - fVar109 * fStack_103c;
          auVar133._0_4_ = fVar102 * local_1088._0_4_ - fVar148 * fVar128;
          auVar133._4_4_ = fVar107 * local_1088._4_4_ - fVar150 * fVar130;
          auVar133._8_4_ = fVar108 * local_1088._8_4_ - fVar151 * fVar131;
          auVar133._12_4_ = fVar109 * local_1088._12_4_ - fVar152 * fVar132;
          auVar65._4_4_ =
               -(uint)((float)((uint)(fVar107 * fStack_1044) & uVar97) <
                      (float)((uint)(fVar150 * fVar130) & uVar97));
          auVar65._0_4_ =
               -(uint)((float)((uint)(fVar102 * local_1048) & uVar91) <
                      (float)((uint)(fVar148 * fVar128) & uVar91));
          auVar65._8_4_ =
               -(uint)((float)((uint)(fVar108 * fStack_1040) & uVar99) <
                      (float)((uint)(fVar151 * fVar131) & uVar99));
          auVar65._12_4_ =
               -(uint)((float)((uint)(fVar109 * fStack_103c) & uVar101) <
                      (float)((uint)(fVar152 * fVar132) & uVar101));
          local_1158 = blendvps(auVar133,auVar106,auVar65);
          fVar100 = fStack_12d0 * local_1178._0_4_ +
                    fVar89 * local_1168._0_4_ + local_1068 * local_1158._0_4_;
          fVar147 = fStack_12d0 * local_1178._4_4_ +
                    fVar89 * local_1168._4_4_ + local_1068 * local_1158._4_4_;
          fVar83 = fStack_12d0 * local_1178._8_4_ +
                   fVar89 * local_1168._8_4_ + local_1068 * local_1158._8_4_;
          fVar89 = fStack_12d0 * local_1178._12_4_ +
                   fVar89 * local_1168._12_4_ + local_1068 * local_1158._12_4_;
          auVar88._0_4_ = fVar100 + fVar100;
          auVar88._4_4_ = fVar147 + fVar147;
          auVar88._8_4_ = fVar83 + fVar83;
          auVar88._12_4_ = fVar89 + fVar89;
          auVar66._0_4_ = fVar138 * local_1168._0_4_ + local_1018 * local_1158._0_4_;
          auVar66._4_4_ = fVar139 * local_1168._4_4_ + fStack_1014 * local_1158._4_4_;
          auVar66._8_4_ = fVar140 * local_1168._8_4_ + fStack_1010 * local_1158._8_4_;
          auVar66._12_4_ = fVar141 * local_1168._12_4_ + fStack_100c * local_1158._12_4_;
          fVar50 = local_1058 * local_1178._0_4_ + auVar66._0_4_;
          fVar71 = fStack_1054 * local_1178._4_4_ + auVar66._4_4_;
          fVar72 = fStack_1050 * local_1178._8_4_ + auVar66._8_4_;
          fVar73 = fStack_104c * local_1178._12_4_ + auVar66._12_4_;
          auVar61 = rcpps(auVar66,auVar88);
          fVar89 = auVar61._0_4_;
          fVar100 = auVar61._4_4_;
          fVar147 = auVar61._8_4_;
          fVar83 = auVar61._12_4_;
          local_12e8 = ((1.0 - auVar88._0_4_ * fVar89) * fVar89 + fVar89) * (fVar50 + fVar50);
          fStack_12e4 = ((1.0 - auVar88._4_4_ * fVar100) * fVar100 + fVar100) * (fVar71 + fVar71);
          fStack_12e0 = ((1.0 - auVar88._8_4_ * fVar147) * fVar147 + fVar147) * (fVar72 + fVar72);
          fStack_12dc = ((1.0 - auVar88._12_4_ * fVar83) * fVar83 + fVar83) * (fVar73 + fVar73);
          fVar89 = *(float *)(ray + k * 4 + 0x80);
          fVar100 = *(float *)(ray + k * 4 + 0x30);
          auVar75._4_4_ = -(uint)(fVar100 <= fStack_12e4);
          auVar75._0_4_ = -(uint)(fVar100 <= local_12e8);
          auVar75._8_4_ = -(uint)(fVar100 <= fStack_12e0);
          auVar75._12_4_ = -(uint)(fVar100 <= fStack_12dc);
          auVar67._0_4_ = -(uint)(local_12e8 <= fVar89 && fVar100 <= local_12e8) & auVar144._0_4_;
          auVar67._4_4_ = -(uint)(fStack_12e4 <= fVar89 && fVar100 <= fStack_12e4) & auVar144._4_4_;
          auVar67._8_4_ = -(uint)(fStack_12e0 <= fVar89 && fVar100 <= fStack_12e0) & auVar144._8_4_;
          auVar67._12_4_ =
               -(uint)(fStack_12dc <= fVar89 && fVar100 <= fStack_12dc) & auVar144._12_4_;
          iVar36 = movmskps(iVar36,auVar67);
          if (iVar36 != 0) {
            valid.field_0.i[0] = auVar67._0_4_ & -(uint)(auVar88._0_4_ != 0.0);
            valid.field_0.i[1] = auVar67._4_4_ & -(uint)(auVar88._4_4_ != 0.0);
            valid.field_0.i[2] = auVar67._8_4_ & -(uint)(auVar88._8_4_ != 0.0);
            valid.field_0.i[3] = auVar67._12_4_ & -(uint)(auVar88._12_4_ != 0.0);
            iVar36 = movmskps(iVar36,(undefined1  [16])valid.field_0);
            if (iVar36 != 0) {
              tNear.field_0.v[2] = local_10b8._8_4_;
              tNear.field_0._0_8_ = local_10b8._0_8_;
              tNear.field_0.v[3] = local_10b8._12_4_;
              auVar34._4_4_ = fStack_10c4;
              auVar34._0_4_ = local_10c8;
              auVar34._8_4_ = fStack_10c0;
              auVar34._12_4_ = fStack_10bc;
              local_1188[0] = local_12e8;
              local_1188[1] = fStack_12e4;
              local_1188[2] = fStack_12e0;
              local_1188[3] = fStack_12dc;
              local_12d8 = context->scene;
              auVar61 = rcpps(auVar75,auVar34);
              fVar89 = auVar61._0_4_;
              fVar100 = auVar61._4_4_;
              fVar147 = auVar61._8_4_;
              fVar83 = auVar61._12_4_;
              fVar89 = (float)(-(uint)(1e-18 <= ABS(local_10c8)) &
                              (uint)(((float)DAT_01feca10 - local_10c8 * fVar89) * fVar89 + fVar89))
              ;
              fVar100 = (float)(-(uint)(1e-18 <= ABS(fStack_10c4)) &
                               (uint)((DAT_01feca10._4_4_ - fStack_10c4 * fVar100) * fVar100 +
                                     fVar100));
              fVar147 = (float)(-(uint)(1e-18 <= ABS(fStack_10c0)) &
                               (uint)((DAT_01feca10._8_4_ - fStack_10c0 * fVar147) * fVar147 +
                                     fVar147));
              fVar83 = (float)(-(uint)(1e-18 <= ABS(fStack_10bc)) &
                              (uint)((DAT_01feca10._12_4_ - fStack_10bc * fVar83) * fVar83 + fVar83)
                              );
              auVar125._0_4_ = fVar121 * fVar89;
              auVar125._4_4_ = fVar126 * fVar100;
              auVar125._8_4_ = local_10b8._8_4_ * fVar147;
              auVar125._12_4_ = local_10b8._12_4_ * fVar83;
              local_11a8 = minps(auVar125,_DAT_01feca10);
              auVar116._0_4_ = fVar89 * local_10a8._0_4_;
              auVar116._4_4_ = fVar100 * local_10a8._4_4_;
              auVar116._8_4_ = fVar147 * local_10a8._8_4_;
              auVar116._12_4_ = fVar83 * local_10a8._12_4_;
              local_1198 = minps(auVar116,_DAT_01feca10);
              auVar30._4_4_ = fStack_12e4;
              auVar30._0_4_ = local_12e8;
              auVar30._8_4_ = fStack_12e0;
              auVar30._12_4_ = fStack_12dc;
              auVar84 = blendvps(_DAT_01feb9f0,auVar30,(undefined1  [16])valid.field_0);
              auVar94._4_4_ = auVar84._0_4_;
              auVar94._0_4_ = auVar84._4_4_;
              auVar94._8_4_ = auVar84._12_4_;
              auVar94._12_4_ = auVar84._8_4_;
              auVar61 = minps(auVar94,auVar84);
              auVar76._0_8_ = auVar61._8_8_;
              auVar76._8_4_ = auVar61._0_4_;
              auVar76._12_4_ = auVar61._4_4_;
              auVar61 = minps(auVar76,auVar61);
              auVar77._0_8_ =
                   CONCAT44(-(uint)(auVar61._4_4_ == auVar84._4_4_) & valid.field_0.i[1],
                            -(uint)(auVar61._0_4_ == auVar84._0_4_) & valid.field_0.i[0]);
              auVar77._8_4_ = -(uint)(auVar61._8_4_ == auVar84._8_4_) & valid.field_0.i[2];
              auVar77._12_4_ = -(uint)(auVar61._12_4_ == auVar84._12_4_) & valid.field_0.i[3];
              iVar36 = movmskps((int)&local_1301,auVar77);
              aVar68 = valid.field_0;
              if (iVar36 != 0) {
                aVar68.i[2] = auVar77._8_4_;
                aVar68._0_8_ = auVar77._0_8_;
                aVar68.i[3] = auVar77._12_4_;
              }
              lVar49 = lVar49 + uVar42;
              uVar40 = movmskps(iVar36,(undefined1  [16])aVar68);
              uVar38 = CONCAT44((int)((ulong)&local_1301 >> 0x20),uVar40);
              lVar48 = 0;
              fStack_12cc = fStack_12d0;
              if (uVar38 != 0) {
                for (; (uVar38 >> lVar48 & 1) == 0; lVar48 = lVar48 + 1) {
                }
              }
LAB_00276fda:
              uVar91 = *(uint *)(lVar49 + 0x120 + lVar48 * 4);
              pRVar39 = (RTCRayN *)(ulong)uVar91;
              pGVar24 = (local_12d8->geometries).items[(long)pRVar39].ptr;
              if ((pGVar24->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                valid.field_0.v[lVar48] = 0.0;
              }
              else {
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar24->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  uVar40 = *(undefined4 *)(local_11a8 + lVar48 * 4);
                  fVar89 = local_1188[lVar48 + -4];
                  *(float *)(ray + k * 4 + 0x80) = local_1188[lVar48];
                  *(undefined4 *)(ray + k * 4 + 0xc0) = *(undefined4 *)(local_1178 + lVar48 * 4);
                  *(undefined4 *)(ray + k * 4 + 0xd0) = *(undefined4 *)(local_1168 + lVar48 * 4);
                  *(undefined4 *)(ray + k * 4 + 0xe0) = *(undefined4 *)(local_1158 + lVar48 * 4);
                  *(undefined4 *)(ray + k * 4 + 0xf0) = uVar40;
                  *(float *)(ray + k * 4 + 0x100) = fVar89;
                  *(undefined4 *)(ray + k * 4 + 0x110) =
                       *(undefined4 *)(lVar49 + 0x130 + lVar48 * 4);
                  *(uint *)(ray + k * 4 + 0x120) = uVar91;
                  *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                  goto LAB_00277488;
                }
                local_fd8 = *(undefined4 *)(local_11a8 + lVar48 * 4);
                local_fc8 = local_1188[lVar48 + -4];
                uVar40 = *(undefined4 *)(local_1178 + lVar48 * 4);
                uVar19 = *(undefined4 *)(local_1168 + lVar48 * 4);
                local_fa8._4_4_ = uVar91;
                local_fa8._0_4_ = uVar91;
                local_fa8._8_4_ = uVar91;
                local_fa8._12_4_ = uVar91;
                uVar21 = *(undefined4 *)(lVar49 + 0x130 + lVar48 * 4);
                local_fb8._4_4_ = uVar21;
                local_fb8._0_4_ = uVar21;
                local_fb8._8_4_ = uVar21;
                local_fb8._12_4_ = uVar21;
                local_ff8._4_4_ = uVar19;
                local_ff8._0_4_ = uVar19;
                local_ff8._8_4_ = uVar19;
                local_ff8._12_4_ = uVar19;
                uVar19 = *(undefined4 *)(local_1158 + lVar48 * 4);
                local_fe8._4_4_ = uVar19;
                local_fe8._0_4_ = uVar19;
                local_fe8._8_4_ = uVar19;
                local_fe8._12_4_ = uVar19;
                local_1008[0] = (RTCHitN)(char)uVar40;
                local_1008[1] = (RTCHitN)(char)((uint)uVar40 >> 8);
                local_1008[2] = (RTCHitN)(char)((uint)uVar40 >> 0x10);
                local_1008[3] = (RTCHitN)(char)((uint)uVar40 >> 0x18);
                local_1008[4] = (RTCHitN)(char)uVar40;
                local_1008[5] = (RTCHitN)(char)((uint)uVar40 >> 8);
                local_1008[6] = (RTCHitN)(char)((uint)uVar40 >> 0x10);
                local_1008[7] = (RTCHitN)(char)((uint)uVar40 >> 0x18);
                local_1008[8] = (RTCHitN)(char)uVar40;
                local_1008[9] = (RTCHitN)(char)((uint)uVar40 >> 8);
                local_1008[10] = (RTCHitN)(char)((uint)uVar40 >> 0x10);
                local_1008[0xb] = (RTCHitN)(char)((uint)uVar40 >> 0x18);
                local_1008[0xc] = (RTCHitN)(char)uVar40;
                local_1008[0xd] = (RTCHitN)(char)((uint)uVar40 >> 8);
                local_1008[0xe] = (RTCHitN)(char)((uint)uVar40 >> 0x10);
                local_1008[0xf] = (RTCHitN)(char)((uint)uVar40 >> 0x18);
                uStack_fd4 = local_fd8;
                uStack_fd0 = local_fd8;
                uStack_fcc = local_fd8;
                fStack_fc4 = local_fc8;
                fStack_fc0 = local_fc8;
                fStack_fbc = local_fc8;
                local_f98 = context->user->instID[0];
                uStack_f94 = local_f98;
                uStack_f90 = local_f98;
                uStack_f8c = local_f98;
                local_f88 = context->user->instPrimID[0];
                uStack_f84 = local_f88;
                uStack_f80 = local_f88;
                uStack_f7c = local_f88;
                uVar40 = *(undefined4 *)(ray + k * 4 + 0x80);
                *(float *)(ray + k * 4 + 0x80) = local_1188[lVar48];
                local_1288 = *local_1270;
                uStack_1280 = local_1270[1];
                args.valid = (int *)&local_1288;
                args.geometryUserPtr = pGVar24->userPtr;
                args.context = context->user;
                args.hit = local_1008;
                args.N = 4;
                pRVar39 = (RTCRayN *)pGVar24->intersectionFilterN;
                args.ray = (RTCRayN *)ray;
                if (pRVar39 != (RTCRayN *)0x0) {
                  pRVar39 = (RTCRayN *)(*(code *)pRVar39)(&args);
                  uVar44 = local_12f0;
                  uVar47 = local_12f8;
                }
                auVar32._8_8_ = uStack_1280;
                auVar32._0_8_ = local_1288;
                if (auVar32 == (undefined1  [16])0x0) {
                  auVar78._8_4_ = 0xffffffff;
                  auVar78._0_8_ = 0xffffffffffffffff;
                  auVar78._12_4_ = 0xffffffff;
                  auVar78 = auVar78 ^ _DAT_01febe20;
                }
                else {
                  pRVar39 = (RTCRayN *)context->args->filter;
                  if ((pRVar39 != (RTCRayN *)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar24->field_8).field_0x2 & 0x40) != 0)
                      ))) {
                    pRVar39 = (RTCRayN *)(*(code *)pRVar39)(&args);
                    uVar44 = local_12f0;
                    uVar47 = local_12f8;
                  }
                  auVar33._8_8_ = uStack_1280;
                  auVar33._0_8_ = local_1288;
                  auVar69._0_4_ = -(uint)((int)local_1288 == 0);
                  auVar69._4_4_ = -(uint)((int)((ulong)local_1288 >> 0x20) == 0);
                  auVar69._8_4_ = -(uint)((int)uStack_1280 == 0);
                  auVar69._12_4_ = -(uint)((int)((ulong)uStack_1280 >> 0x20) == 0);
                  auVar78 = auVar69 ^ _DAT_01febe20;
                  if (auVar33 != (undefined1  [16])0x0) {
                    auVar61 = blendvps(*(undefined1 (*) [16])args.hit,
                                       *(undefined1 (*) [16])(args.ray + 0xc0),auVar69);
                    *(undefined1 (*) [16])(args.ray + 0xc0) = auVar61;
                    auVar61 = blendvps(*(undefined1 (*) [16])(args.hit + 0x10),
                                       *(undefined1 (*) [16])(args.ray + 0xd0),auVar69);
                    *(undefined1 (*) [16])(args.ray + 0xd0) = auVar61;
                    auVar61 = blendvps(*(undefined1 (*) [16])(args.hit + 0x20),
                                       *(undefined1 (*) [16])(args.ray + 0xe0),auVar69);
                    *(undefined1 (*) [16])(args.ray + 0xe0) = auVar61;
                    auVar61 = blendvps(*(undefined1 (*) [16])(args.hit + 0x30),
                                       *(undefined1 (*) [16])(args.ray + 0xf0),auVar69);
                    *(undefined1 (*) [16])(args.ray + 0xf0) = auVar61;
                    auVar61 = blendvps(*(undefined1 (*) [16])(args.hit + 0x40),
                                       *(undefined1 (*) [16])(args.ray + 0x100),auVar69);
                    *(undefined1 (*) [16])(args.ray + 0x100) = auVar61;
                    auVar61 = blendvps(*(undefined1 (*) [16])(args.hit + 0x50),
                                       *(undefined1 (*) [16])(args.ray + 0x110),auVar69);
                    *(undefined1 (*) [16])(args.ray + 0x110) = auVar61;
                    auVar61 = blendvps(*(undefined1 (*) [16])(args.hit + 0x60),
                                       *(undefined1 (*) [16])(args.ray + 0x120),auVar69);
                    *(undefined1 (*) [16])(args.ray + 0x120) = auVar61;
                    auVar61 = blendvps(*(undefined1 (*) [16])(args.hit + 0x70),
                                       *(undefined1 (*) [16])(args.ray + 0x130),auVar69);
                    *(undefined1 (*) [16])(args.ray + 0x130) = auVar61;
                    auVar61 = blendvps(*(undefined1 (*) [16])(args.hit + 0x80),
                                       *(undefined1 (*) [16])(args.ray + 0x140),auVar69);
                    *(undefined1 (*) [16])(args.ray + 0x140) = auVar61;
                    pRVar39 = args.ray;
                  }
                }
                if ((_DAT_01fecb20 & auVar78) == (undefined1  [16])0x0) {
                  *(undefined4 *)(ray + k * 4 + 0x80) = uVar40;
                }
                valid.field_0.v[lVar48] = 0.0;
                fVar89 = *(float *)(ray + k * 4 + 0x80);
                valid.field_0.i[1] = -(uint)(fStack_12e4 <= fVar89) & valid.field_0.i[1];
                valid.field_0.i[0] = -(uint)(local_12e8 <= fVar89) & valid.field_0.i[0];
                valid.field_0.i[2] = -(uint)(fStack_12e0 <= fVar89) & valid.field_0.i[2];
                valid.field_0.i[3] = -(uint)(fStack_12dc <= fVar89) & valid.field_0.i[3];
              }
              iVar36 = movmskps((int)pRVar39,(undefined1  [16])valid.field_0);
              if (iVar36 == 0) goto LAB_00277488;
              auVar31._4_4_ = fStack_12e4;
              auVar31._0_4_ = local_12e8;
              auVar31._8_4_ = fStack_12e0;
              auVar31._12_4_ = fStack_12dc;
              auVar84 = blendvps(_DAT_01feb9f0,auVar31,(undefined1  [16])valid.field_0);
              auVar95._4_4_ = auVar84._0_4_;
              auVar95._0_4_ = auVar84._4_4_;
              auVar95._8_4_ = auVar84._12_4_;
              auVar95._12_4_ = auVar84._8_4_;
              auVar61 = minps(auVar95,auVar84);
              auVar79._0_8_ = auVar61._8_8_;
              auVar79._8_4_ = auVar61._0_4_;
              auVar79._12_4_ = auVar61._4_4_;
              auVar61 = minps(auVar79,auVar61);
              auVar80._0_8_ =
                   CONCAT44(-(uint)(auVar61._4_4_ == auVar84._4_4_) & valid.field_0._4_4_,
                            -(uint)(auVar61._0_4_ == auVar84._0_4_) & valid.field_0._0_4_);
              auVar80._8_4_ = -(uint)(auVar61._8_4_ == auVar84._8_4_) & valid.field_0._8_4_;
              auVar80._12_4_ = -(uint)(auVar61._12_4_ == auVar84._12_4_) & valid.field_0._12_4_;
              iVar36 = movmskps(iVar36,auVar80);
              aVar70 = valid.field_0;
              if (iVar36 != 0) {
                aVar70.i[2] = auVar80._8_4_;
                aVar70._0_8_ = auVar80._0_8_;
                aVar70.i[3] = auVar80._12_4_;
              }
              uVar40 = movmskps(iVar36,(undefined1  [16])aVar70);
              uVar38 = CONCAT44((int)((ulong)pRVar39 >> 0x20),uVar40);
              lVar48 = 0;
              if (uVar38 != 0) {
                for (; (uVar38 >> lVar48 & 1) == 0; lVar48 = lVar48 + 1) {
                }
              }
              goto LAB_00276fda;
            }
          }
        }
LAB_00277488:
        lVar46 = lVar46 + 1;
      } while (lVar46 != uVar43 - 8);
    }
    uVar40 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar61._4_4_ = uVar40;
    auVar61._0_4_ = uVar40;
    auVar61._8_4_ = uVar40;
    auVar61._12_4_ = uVar40;
    uVar43 = local_1260;
    uVar42 = local_1268;
    uVar38 = local_1258;
    fVar89 = local_10f8;
    fVar100 = fStack_10f4;
    fVar147 = fStack_10f0;
    fVar83 = fStack_10ec;
    fVar50 = local_1108;
    fVar71 = fStack_1104;
    fVar72 = fStack_1100;
    fVar73 = fStack_10fc;
    fVar74 = local_1118;
    fVar81 = fStack_1114;
    fVar82 = fStack_1110;
    fVar90 = fStack_110c;
    fVar96 = local_1148;
    fVar98 = fStack_1144;
    fVar102 = fStack_1140;
    fVar107 = fStack_113c;
    fVar108 = local_10d8;
    fVar109 = fStack_10d4;
    fVar110 = fStack_10d0;
    fVar117 = fStack_10cc;
    fVar118 = local_10e8;
    fVar119 = fStack_10e4;
    fVar121 = fStack_10e0;
    fVar126 = fStack_10dc;
    fVar128 = local_1128;
    fVar130 = fStack_1124;
    fVar131 = fStack_1120;
    fVar132 = fStack_111c;
    fVar134 = local_1138;
    fVar135 = fStack_1134;
    fVar136 = fStack_1130;
    fVar137 = fStack_112c;
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }